

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall VmaJsonWriter::BeginArray(VmaJsonWriter *this,bool singleLine)

{
  byte bVar1;
  byte in_SIL;
  VmaStringBuilder *in_RDI;
  StackItem item;
  char in_stack_ffffffffffffffdf;
  undefined4 in_stack_ffffffffffffffec;
  undefined1 in_stack_fffffffffffffff0;
  undefined6 in_stack_fffffffffffffff1;
  
  bVar1 = in_SIL & 1;
  BeginValue((VmaJsonWriter *)
             (CONCAT17(in_SIL,CONCAT61(in_stack_fffffffffffffff1,in_stack_fffffffffffffff0)) &
             0x1ffffffffffffff),SUB41((uint)in_stack_ffffffffffffffec >> 0x18,0));
  VmaStringBuilder::Add(in_RDI,in_stack_ffffffffffffffdf);
  VmaVector<VmaJsonWriter::StackItem,_VmaStlAllocator<VmaJsonWriter::StackItem>_>::push_back
            ((VmaVector<VmaJsonWriter::StackItem,_VmaStlAllocator<VmaJsonWriter::StackItem>_> *)
             (CONCAT17(bVar1,CONCAT61(in_stack_fffffffffffffff1,bVar1)) & 0xffffffffffffff01),
             (StackItem *)0x1);
  return;
}

Assistant:

void VmaJsonWriter::BeginArray(bool singleLine)
{
    VMA_ASSERT(!m_InsideString);

    BeginValue(false);
    m_SB.Add('[');

    StackItem item;
    item.type = COLLECTION_TYPE_ARRAY;
    item.valueCount = 0;
    item.singleLineMode = singleLine;
    m_Stack.push_back(item);
}